

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O1

void __thiscall Dinic::addEdge(Dinic *this,int a,int b,Flow cap)

{
  pointer *ppEVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  iterator iVar3;
  iterator iVar4;
  int iVar5;
  Edge local_40;
  
  local_40.flow = 0;
  iVar3._M_current =
       (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_40.a = a;
  local_40.b = b;
  local_40.cap = cap;
  if (iVar3._M_current ==
      (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<Edge,_std::allocator<Edge>_>::_M_realloc_insert<Edge>(&this->e,iVar3,&local_40);
  }
  else {
    (iVar3._M_current)->cap = cap;
    (iVar3._M_current)->flow = 0;
    (iVar3._M_current)->a = a;
    (iVar3._M_current)->b = b;
    ppEVar1 = &(this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  pvVar2 = (this->g).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + a;
  iVar5 = (int)((ulong)((long)(this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) * -0x55555555 + -1;
  local_40.flow = CONCAT44(local_40.flow._4_4_,iVar5);
  iVar4._M_current =
       (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar4._M_current ==
      (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar2,iVar4,(int *)&local_40);
  }
  else {
    *iVar4._M_current = iVar5;
    (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  local_40.flow = 0;
  local_40.cap = 0;
  iVar3._M_current =
       (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_40.a = b;
  local_40.b = a;
  if (iVar3._M_current ==
      (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<Edge,_std::allocator<Edge>_>::_M_realloc_insert<Edge>(&this->e,iVar3,&local_40);
  }
  else {
    (iVar3._M_current)->cap = 0;
    (iVar3._M_current)->flow = 0;
    (iVar3._M_current)->a = b;
    (iVar3._M_current)->b = a;
    ppEVar1 = &(this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  pvVar2 = (this->g).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + b;
  iVar5 = (int)((ulong)((long)(this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) * -0x55555555 + -1;
  local_40.flow = CONCAT44(local_40.flow._4_4_,iVar5);
  iVar4._M_current =
       (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar4._M_current ==
      (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar2,iVar4,(int *)&local_40);
  }
  else {
    *iVar4._M_current = iVar5;
    (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  return;
}

Assistant:

void addEdge(int a, int b, Flow cap) {
        e.push_back(Edge(a, b, cap));
        g[a].push_back(e.size() - 1);
        e.push_back(Edge(b, a, 0));
        g[b].push_back(e.size() - 1);
    }